

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

void rnn_parsefile(rnndb *db,char *file_orig)

{
  int iVar1;
  FILE *__stream;
  void *pvVar2;
  long lVar3;
  xmlNode *local_50;
  xmlNode *chain;
  xmlNode *root;
  xmlDocPtr doc;
  FILE *file;
  char *rnn_path;
  char *fname;
  char *pcStack_18;
  int i;
  char *file_orig_local;
  rnndb *db_local;
  
  pcStack_18 = file_orig;
  file_orig_local = (char *)db;
  file = (FILE *)getenv("RNN_PATH");
  if (file == (FILE *)0x0) {
    file = (FILE *)anon_var_dwarf_696;
  }
  __stream = (FILE *)find_in_path(pcStack_18,(char *)file,&rnn_path);
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"%s: couldn\'t find database file. Please set the env var RNN_PATH.\n",
            pcStack_18);
    file_orig_local[0x80] = '\x01';
    file_orig_local[0x81] = '\0';
    file_orig_local[0x82] = '\0';
    file_orig_local[0x83] = '\0';
  }
  else {
    fclose(__stream);
    for (fname._4_4_ = 0; fname._4_4_ < *(int *)(file_orig_local + 0x78);
        fname._4_4_ = fname._4_4_ + 1) {
      iVar1 = strcmp(*(char **)(*(long *)(file_orig_local + 0x70) + (long)fname._4_4_ * 8),rnn_path)
      ;
      if (iVar1 == 0) {
        free(rnn_path);
        return;
      }
    }
    if (*(int *)(file_orig_local + 0x7c) <= *(int *)(file_orig_local + 0x78)) {
      if (*(int *)(file_orig_local + 0x7c) == 0) {
        file_orig_local[0x7c] = '\x10';
        file_orig_local[0x7d] = '\0';
        file_orig_local[0x7e] = '\0';
        file_orig_local[0x7f] = '\0';
      }
      else {
        *(int *)(file_orig_local + 0x7c) = *(int *)(file_orig_local + 0x7c) << 1;
      }
      pvVar2 = realloc(*(void **)(file_orig_local + 0x70),
                       (long)*(int *)(file_orig_local + 0x7c) << 3);
      *(void **)(file_orig_local + 0x70) = pvVar2;
    }
    iVar1 = *(int *)(file_orig_local + 0x78);
    *(int *)(file_orig_local + 0x78) = iVar1 + 1;
    *(char **)(*(long *)(file_orig_local + 0x70) + (long)iVar1 * 8) = rnn_path;
    lVar3 = xmlParseFile(rnn_path);
    if (lVar3 == 0) {
      fprintf(_stderr,"%s: couldn\'t open database file. Please set the env var RNN_PATH.\n",
              rnn_path);
      file_orig_local[0x80] = '\x01';
      file_orig_local[0x81] = '\0';
      file_orig_local[0x82] = '\0';
      file_orig_local[0x83] = '\0';
    }
    else {
      for (chain = *(xmlNode **)(lVar3 + 0x18); chain != (xmlNode *)0x0; chain = chain->next) {
        if (chain->type == XML_ELEMENT_NODE) {
          iVar1 = strcmp((char *)chain->name,"database");
          if (iVar1 == 0) {
            for (local_50 = chain->children; local_50 != (xmlNode *)0x0; local_50 = local_50->next)
            {
              if (((local_50->type == XML_ELEMENT_NODE) &&
                  (iVar1 = trytop((rnndb *)file_orig_local,rnn_path,local_50), iVar1 == 0)) &&
                 (iVar1 = trydoc((rnndb *)file_orig_local,rnn_path,local_50), iVar1 == 0)) {
                fprintf(_stderr,"%s:%d: wrong tag in database: <%s>\n",rnn_path,
                        (ulong)local_50->line,local_50->name);
                file_orig_local[0x80] = '\x01';
                file_orig_local[0x81] = '\0';
                file_orig_local[0x82] = '\0';
                file_orig_local[0x83] = '\0';
              }
            }
          }
          else {
            fprintf(_stderr,"%s:%d: wrong top-level tag <%s>\n",rnn_path,(ulong)chain->line,
                    chain->name);
            file_orig_local[0x80] = '\x01';
            file_orig_local[0x81] = '\0';
            file_orig_local[0x82] = '\0';
            file_orig_local[0x83] = '\0';
          }
        }
      }
      xmlFreeDoc(lVar3);
    }
  }
  return;
}

Assistant:

void rnn_parsefile (struct rnndb *db, char *file_orig) {
	int i;
	char *fname;
	const char *rnn_path = getenv("RNN_PATH");

	if (!rnn_path)
		rnn_path = RNN_DEF_PATH;

	FILE *file = find_in_path(file_orig, rnn_path, &fname);
	if (!file) {
		fprintf (stderr, "%s: couldn't find database file. Please set the env var RNN_PATH.\n", file_orig);
		db->estatus = 1;
		return;
	}
	fclose(file);

	for (i = 0; i < db->filesnum; i++)
		if (!strcmp(db->files[i], fname)) {
			free(fname);
			return;
		}
		
	ADDARRAY(db->files, fname);
	xmlDocPtr doc = xmlParseFile(fname);
	if (!doc) {
		fprintf (stderr, "%s: couldn't open database file. Please set the env var RNN_PATH.\n", fname);
		db->estatus = 1;
		return;
	}
	xmlNode *root = doc->children;
	while (root) {
		if (root->type != XML_ELEMENT_NODE) {
		} else if (strcmp(root->name, "database")) {
			fprintf (stderr, "%s:%d: wrong top-level tag <%s>\n", fname, root->line, root->name);
			db->estatus = 1;
		} else {
			xmlNode *chain = root->children;
			while (chain) {
				if (chain->type != XML_ELEMENT_NODE) {
				} else if (!trytop(db, fname, chain) && !trydoc(db, fname, chain)) {
					fprintf (stderr, "%s:%d: wrong tag in database: <%s>\n", fname, chain->line, chain->name);
					db->estatus = 1;
				}
				chain = chain->next;
			}
		}
		root = root->next;
	}
	xmlFreeDoc(doc);
}